

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Format::get_ids(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Format *this,
               CylHead *cylhead)

{
  int iVar1;
  long lVar2;
  size_type __n;
  int s;
  int iVar3;
  reference rVar4;
  vector<bool,_std::allocator<bool>_> used;
  allocator_type local_69;
  vector<int,_std::allocator<int>_> *local_68;
  CylHead *local_60;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  local_60 = cylhead;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,(long)this->sectors,&local_69);
  local_68 = __return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)this->sectors,(allocator_type *)&local_69);
  iVar1 = this->base;
  for (iVar3 = 0; iVar3 < this->sectors; iVar3 = iVar3 + 1) {
    lVar2 = (long)(local_60->cyl * this->skew + this->interleave * iVar3 + this->offset) %
            (long)this->sectors;
    while( true ) {
      __n = (size_type)(int)lVar2;
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&local_58,__n);
      if ((*rVar4._M_p & rVar4._M_mask) == 0) break;
      lVar2 = (long)((int)lVar2 + 1) % (long)this->sectors;
    }
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&local_58,__n);
    *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
    (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[__n] = iVar3 + iVar1;
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  return local_68;
}

Assistant:

std::vector<int> Format::get_ids(const CylHead& cylhead) const
{
    std::vector<bool> used(sectors);
    std::vector<int> ids(sectors);

    auto base_id = base;

    for (auto s = 0; s < sectors; ++s)
    {
        // Calculate the expected sector index using the interleave and skew
        auto index = (offset + s * interleave + skew * (cylhead.cyl)) % sectors;

        // Find a free slot starting from the expected position
        for (; used[index]; index = (index + 1) % sectors);
        used[index] = 1;

        // Assign the sector number, with offset adjustments
        ids[index] = base_id + s;
    }

    return ids;
}